

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O2

long * __thiscall mocker::Token::val<long>(Token *this)

{
  shared_ptr<mocker::Token::Val<long>_> ptr;
  
  std::dynamic_pointer_cast<mocker::Token::Val<long>,mocker::Token::ValBase>
            ((shared_ptr<mocker::Token::ValBase> *)&ptr);
  if (ptr.super___shared_ptr<mocker::Token::Val<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptr.super___shared_ptr<mocker::Token::Val<long>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return &(ptr.super___shared_ptr<mocker::Token::Val<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            val;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/token.h"
                ,0x7c,"const T &mocker::Token::val() const [T = long]");
}

Assistant:

const T &val() const {
    detail::checkTokenType<T>();
    auto ptr = std::dynamic_pointer_cast<Val<T>>(valPtr);
    assert(ptr);
    return ptr->val;
  }